

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O1

void __thiscall PrintType::print(PrintType *this,Printer *p)

{
  Type *pTVar1;
  PrintType *pPVar2;
  int iVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  char *__s;
  Type local_50;
  PrintTuple<PrintType> local_48;
  char *local_38;
  
  iVar3 = (*this->type->_vptr_Type[2])();
  switch(iVar3) {
  case 0:
    __s = "Int";
    break;
  default:
    goto switchD_00127c08_caseD_1;
  case 2:
    __s = "Function";
    break;
  case 3:
    __s = "Struct";
    break;
  case 4:
    __s = "Enum";
    break;
  case 5:
    pTVar1 = this->type;
    StringView::strchr("Tuple((",0);
    std::ostream::write((char *)p->ostream,0x13addd);
    pp_Var4 = pTVar1[1]._vptr_Type;
    if (pTVar1[2]._vptr_Type != pp_Var4) {
      uVar5 = 0;
      do {
        pPVar2 = (PrintType *)pp_Var4[uVar5];
        if (uVar5 != 0) {
          StringView::strchr(",",0);
          std::ostream::write((char *)p->ostream,0x13a91e);
        }
        local_48.t0 = pPVar2;
        print((PrintType *)&local_48,p);
        uVar5 = uVar5 + 1;
        pp_Var4 = pTVar1[1]._vptr_Type;
      } while (uVar5 < (ulong)((long)pTVar1[2]._vptr_Type - (long)pp_Var4 >> 3));
    }
    StringView::strchr("))",0);
    std::ostream::write((char *)p->ostream,0x13ade5);
    return;
  case 6:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_38 = "Array(%)";
    goto LAB_00127d32;
  case 7:
    __s = "String";
    break;
  case 8:
    __s = "StringIterator";
    break;
  case 9:
    __s = "Void";
    break;
  case 10:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_48.t0 = (PrintType *)&local_50;
    local_38 = "Reference(%)";
    PrintTuple<PrintType>::print_formatted(&local_48,p,"Reference(%)");
  case 0xb:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_38 = "Type(%)";
LAB_00127d32:
    local_48.t0 = (PrintType *)&local_50;
    PrintTuple<PrintType>::print_formatted(&local_48,p,local_38);
switchD_00127c08_caseD_1:
    return;
  }
  StringView::strchr(__s,0);
  std::ostream::write((char *)p->ostream,(long)__s);
  return;
}

Assistant:

void print(const Printer& p) const {
		switch (type->get_id()) {
		case TypeId::INT:
			p.print("Int");
			break;
		case TypeId::CLOSURE:
			p.print("Function");
			break;
		case TypeId::STRUCT:
			p.print("Struct");
			break;
		case TypeId::ENUM:
			p.print("Enum");
			break;
		case TypeId::TUPLE:
			{
				const TupleType* tuple_type = static_cast<const TupleType*>(type);
				p.print("Tuple((");
				for (std::size_t i = 0; i < tuple_type->get_element_types().size(); ++i) {
					const Type* element_type = tuple_type->get_element_types()[i];
					if (i > 0) p.print(",");
					p.print(PrintType(element_type));
				}
				p.print("))");
				break;
			}
		case TypeId::ARRAY:
			{
				const Type* element_type = static_cast<const ArrayType*>(type)->get_element_type();
				p.print(format("Array(%)", PrintType(element_type)));
				break;
			}
		case TypeId::STRING:
			p.print("String");
			break;
		case TypeId::STRING_ITERATOR:
			p.print("StringIterator");
			break;
		case TypeId::VOID:
			p.print("Void");
			break;
		case TypeId::REFERENCE:
			{
				const Type* value_type = static_cast<const ReferenceType*>(type)->get_type();
				p.print(format("Reference(%)", PrintType(value_type)));
			}
		case TypeId::TYPE:
			{
				const Type* type_type = static_cast<const TypeType*>(type)->get_type();
				p.print(format("Type(%)", PrintType(type_type)));
				break;
			}
		default:
			break;
		}
	}